

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O1

int __thiscall
ncnn::CopyTo::forward
          (CopyTo *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  pointer __fn;
  size_t sVar6;
  int *piVar7;
  int iVar8;
  undefined4 in_EAX;
  int iVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  void *in_R8;
  size_t sVar13;
  void *pvVar14;
  Mat *pMVar15;
  int iVar16;
  void *pvVar17;
  undefined1 auVar18 [16];
  int _woffset;
  int _hoffset;
  int h_1;
  int h;
  int _coffset;
  int _doffset;
  int local_150;
  int local_14c;
  size_t local_148;
  long local_140;
  void *local_138;
  long local_130;
  long local_128;
  void *local_120;
  size_t local_118;
  void *local_110;
  size_t local_108;
  size_t local_100;
  long local_f8;
  long local_f0;
  size_t local_e8;
  long local_e0;
  Mat local_d8;
  ulong local_90;
  long local_88;
  int local_7c;
  size_t local_78;
  int local_6c;
  long local_68;
  Mat *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  __fn = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = __fn->dims;
  sVar6 = __fn->elemsize;
  if (__fn[1].dims == uVar5) {
    uVar1 = __fn->w;
    uVar2 = __fn->h;
    uVar3 = __fn->d;
    uVar4 = __fn->c;
    auVar18._0_4_ = -(uint)(__fn[1].w == uVar1);
    auVar18._4_4_ = -(uint)(__fn[1].h == uVar2);
    auVar18._8_4_ = -(uint)(__fn[1].d == uVar3);
    auVar18._12_4_ = -(uint)(__fn[1].c == uVar4);
    iVar9 = movmskps(in_EAX,auVar18);
    if (iVar9 == 0xf) {
      if (pMVar15 != __fn + 1) {
        piVar7 = __fn[1].refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        piVar7 = pMVar15->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (pMVar15->allocator == (Allocator *)0x0) {
              if (pMVar15->data != (void *)0x0) {
                free(pMVar15->data);
              }
            }
            else {
              (*pMVar15->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar15->cstep = 0;
        pMVar15->data = (void *)0x0;
        pMVar15->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&pMVar15->refcount + 4) = (undefined1  [16])0x0;
        pMVar15->dims = 0;
        pMVar15->w = 0;
        pMVar15->h = 0;
        pMVar15->d = 0;
        pMVar15->c = 0;
        piVar7 = __fn[1].refcount;
        pMVar15->data = __fn[1].data;
        pMVar15->refcount = piVar7;
        pMVar15->elemsize = __fn[1].elemsize;
        pMVar15->elempack = __fn[1].elempack;
        pMVar15->allocator = __fn[1].allocator;
        iVar9 = __fn[1].w;
        iVar16 = __fn[1].h;
        iVar8 = __fn[1].d;
        pMVar15->dims = __fn[1].dims;
        pMVar15->w = iVar9;
        pMVar15->h = iVar16;
        pMVar15->d = iVar8;
        pMVar15->c = __fn[1].c;
        pMVar15->cstep = __fn[1].cstep;
        return 0;
      }
      return 0;
    }
  }
  Mat::clone(&local_d8,(__fn *)__fn,opt->blob_allocator,(int)opt,in_R8);
  if (pMVar15 != &local_d8) {
    piVar7 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = pMVar15->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (pMVar15->allocator == (Allocator *)0x0) {
          if (pMVar15->data != (void *)0x0) {
            free(pMVar15->data);
          }
        }
        else {
          (*pMVar15->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar15->cstep = 0;
    pMVar15->data = (void *)0x0;
    pMVar15->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar15->refcount + 4) = (undefined1  [16])0x0;
    pMVar15->dims = 0;
    pMVar15->w = 0;
    pMVar15->h = 0;
    pMVar15->d = 0;
    pMVar15->c = 0;
    pMVar15->data = local_d8.data;
    pMVar15->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    pMVar15->elemsize = local_d8.elemsize;
    pMVar15->elempack = local_d8.elempack;
    pMVar15->allocator = local_d8.allocator;
    pMVar15->dims = local_d8.dims;
    pMVar15->w = local_d8.w;
    pMVar15->h = local_d8.h;
    pMVar15->d = local_d8.d;
    pMVar15->c = local_d8.c;
    pMVar15->cstep = local_d8.cstep;
  }
  piVar7 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pMVar15->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar15->c * pMVar15->cstep == 0) {
    return -100;
  }
  switch(__fn->dims) {
  case 1:
    local_d8.cstep = (long)__fn->elempack * (long)__fn->w;
    local_d8.elemsize = 4;
    local_d8.elempack = 1;
    local_d8.dims = 1;
    local_d8.w = (int)local_d8.cstep;
    local_d8.h = 1;
    local_d8.d = 1;
    local_d8.c = 1;
    break;
  case 2:
    local_d8.w = __fn->w;
    lVar10 = (long)__fn->elempack * (long)__fn->h;
    local_d8.elemsize = 4;
    local_d8.elempack = 1;
    local_d8.dims = 2;
    local_d8.h = (int)lVar10;
    local_d8.d = 1;
    local_d8.c = 1;
    local_d8.cstep = lVar10 * local_d8.w;
    break;
  case 3:
    local_d8.w = __fn->w;
    local_d8.h = __fn->h;
    local_d8.c = __fn->elempack * __fn->c;
    local_d8.dims = 3;
    local_d8.d = 1;
    lVar10 = (long)local_d8.h * (long)local_d8.w;
    goto LAB_00590596;
  case 4:
    local_d8.w = __fn->w;
    local_d8.h = __fn->h;
    local_d8.d = __fn->d;
    local_d8.c = __fn->elempack * __fn->c;
    local_d8.dims = 4;
    lVar10 = (long)local_d8.h * (long)local_d8.w * (long)local_d8.d;
LAB_00590596:
    local_d8.elempack = 1;
    local_d8.elemsize = 4;
    local_d8.cstep = lVar10 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    local_d8.cstep = 0;
    local_d8.elemsize = 0;
    local_d8.elempack = 0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
  }
  local_d8.allocator = (Allocator *)0x0;
  local_d8.refcount._4_4_ = 0;
  local_d8.refcount._0_4_ = 0;
  local_d8.data = (void *)0x0;
  local_148 = sVar6;
  resolve_copyto_offset(this,&local_d8,&local_150,&local_14c,&local_6c,&local_7c);
  piVar7 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_60 = pMVar15;
  switch(uVar5) {
  case 1:
    if (local_148 == 4) {
      iVar9 = __fn[1].h;
      if (0 < iVar9) {
        pvVar17 = (void *)((long)local_150 * 4 + (long)pMVar15->data);
        pvVar11 = __fn[1].data;
        sVar13 = (long)__fn[1].w * 4;
        do {
          memcpy(pvVar17,pvVar11,sVar13);
          pvVar17 = (void *)((long)pvVar17 + (long)pMVar15->w * 4);
          pvVar11 = (void *)((long)pvVar11 + sVar13);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else if (local_148 == 2) {
      iVar9 = __fn[1].h;
      if (0 < iVar9) {
        pvVar17 = (void *)((long)local_150 * 2 + (long)pMVar15->data);
        pvVar11 = __fn[1].data;
        sVar13 = (long)__fn[1].w * 2;
        do {
          memcpy(pvVar17,pvVar11,sVar13);
          pvVar17 = (void *)((long)pvVar17 + (long)pMVar15->w * 2);
          pvVar11 = (void *)((long)pvVar11 + sVar13);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else if ((local_148 == 1) && (iVar9 = __fn[1].h, 0 < iVar9)) {
      pvVar11 = (void *)((long)local_150 + (long)pMVar15->data);
      pvVar17 = __fn[1].data;
      iVar16 = __fn[1].w;
      do {
        memcpy(pvVar11,pvVar17,(long)iVar16);
        pvVar17 = (void *)((long)pvVar17 + (long)iVar16);
        pvVar11 = (void *)((long)pvVar11 + (long)pMVar15->w);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if (uVar5 != 4) {
      if (uVar5 != 3) {
        if (uVar5 != 2) {
          return 0;
        }
        goto switchD_005906f2_caseD_2;
      }
      goto switchD_005906f2_caseD_3;
    }
    break;
  case 2:
switchD_005906f2_caseD_2:
    if (local_148 == 4) {
      iVar9 = __fn[1].h;
      if (0 < iVar9) {
        pvVar17 = (void *)((long)pMVar15->data +
                          (long)local_150 * 4 +
                          (long)pMVar15->w * (long)local_14c * pMVar15->elemsize);
        pvVar11 = __fn[1].data;
        sVar13 = (long)__fn[1].w * 4;
        do {
          memcpy(pvVar17,pvVar11,sVar13);
          pvVar17 = (void *)((long)pvVar17 + (long)pMVar15->w * 4);
          pvVar11 = (void *)((long)pvVar11 + sVar13);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else if (local_148 == 2) {
      iVar9 = __fn[1].h;
      if (0 < iVar9) {
        pvVar17 = (void *)((long)pMVar15->data +
                          (long)local_150 * 2 +
                          (long)pMVar15->w * (long)local_14c * pMVar15->elemsize);
        pvVar11 = __fn[1].data;
        sVar13 = (long)__fn[1].w * 2;
        do {
          memcpy(pvVar17,pvVar11,sVar13);
          pvVar17 = (void *)((long)pvVar17 + (long)pMVar15->w * 2);
          pvVar11 = (void *)((long)pvVar11 + sVar13);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
    }
    else if ((local_148 == 1) && (iVar9 = __fn[1].h, 0 < iVar9)) {
      pvVar11 = (void *)((long)pMVar15->data +
                        (long)local_150 + (long)pMVar15->w * (long)local_14c * pMVar15->elemsize);
      pvVar17 = __fn[1].data;
      iVar16 = __fn[1].w;
      do {
        memcpy(pvVar11,pvVar17,(long)iVar16);
        pvVar17 = (void *)((long)pvVar17 + (long)iVar16);
        pvVar11 = (void *)((long)pvVar11 + (long)pMVar15->w);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if (uVar5 != 4) {
      if (uVar5 != 3) {
        return 0;
      }
      goto switchD_005906f2_caseD_3;
    }
    break;
  case 3:
switchD_005906f2_caseD_3:
    local_90 = (ulong)uVar5;
    if (0 < __fn[1].c) {
      local_120 = (void *)(long)local_7c;
      local_88 = (long)local_150;
      local_140 = (long)local_14c;
      local_f8 = local_88 * 2;
      local_f0 = local_88 * 4;
      local_128 = 0;
      local_78 = (size_t)local_120;
      do {
        sVar13 = (size_t)__fn[1].w;
        iVar9 = __fn[1].h;
        pvVar17 = __fn[1].data;
        local_108 = __fn[1].elemsize;
        local_100 = __fn[1].cstep;
        lVar10 = (long)pMVar15->w;
        local_110 = pMVar15->data;
        sVar6 = pMVar15->elemsize;
        local_118 = pMVar15->cstep;
        if (local_148 == 4) {
LAB_00590b54:
          if (0 < iVar9) {
LAB_00590b58:
            pvVar11 = (void *)((long)local_110 +
                              sVar6 * (local_140 * lVar10 + local_118 * (long)local_120) + local_f0)
            ;
            pvVar17 = (void *)((long)pvVar17 + local_100 * local_108 * local_128);
            do {
              memcpy(pvVar11,pvVar17,sVar13 * 4);
              pvVar11 = (void *)((long)pvVar11 + lVar10 * 4);
              pvVar17 = (void *)((long)pvVar17 + sVar13 * 4);
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
        }
        else if (local_148 == 2) {
LAB_00590a9d:
          local_138 = pvVar17;
          local_130 = lVar10;
          local_e8 = sVar13;
          if (0 < iVar9) {
            pvVar11 = (void *)((long)local_110 +
                              (local_140 * lVar10 + local_118 * (long)local_120) * sVar6 + local_f8)
            ;
            local_e0 = lVar10 * 2;
            pvVar17 = (void *)(local_100 * local_108 * local_128 + (long)pvVar17);
            iVar16 = iVar9;
            do {
              memcpy(pvVar11,pvVar17,sVar13 * 2);
              pvVar11 = (void *)((long)pvVar11 + local_e0);
              pvVar17 = (void *)((long)pvVar17 + sVar13 * 2);
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          pvVar17 = local_138;
          lVar10 = local_130;
          sVar13 = local_e8;
          if (local_148 == 4 && 0 < iVar9) goto LAB_00590b58;
        }
        else if (local_148 == 1) {
          local_e0 = CONCAT44(local_e0._4_4_,iVar9);
          local_138 = pvVar17;
          if (0 < iVar9) {
            pvVar17 = (void *)(local_100 * local_128 * local_108 + (long)pvVar17);
            pvVar11 = (void *)((long)local_110 +
                              sVar6 * lVar10 * local_140 + local_88 +
                              (local_78 + local_128) * local_118 * sVar6);
            local_130 = lVar10;
            do {
              memcpy(pvVar11,pvVar17,sVar13);
              pvVar17 = (void *)((long)pvVar17 + sVar13);
              pvVar11 = (void *)((long)pvVar11 + local_130);
              iVar9 = iVar9 + -1;
              lVar10 = local_130;
            } while (iVar9 != 0);
          }
          pvVar17 = local_138;
          iVar9 = (int)local_e0;
          if (local_148 == 4) goto LAB_00590b54;
          if (local_148 == 2) goto LAB_00590a9d;
        }
        local_128 = local_128 + 1;
        local_120 = (void *)((long)local_120 + 1);
        pMVar15 = local_60;
      } while (local_128 < __fn[1].c);
    }
    if ((int)local_90 != 4) {
      return 0;
    }
    break;
  case 4:
    break;
  default:
    goto LAB_00591017;
  }
  if (0 < __fn[1].c) {
    local_90 = (ulong)local_7c;
    local_68 = (long)local_6c;
    local_50 = (long)local_150;
    local_88 = (long)local_14c;
    local_40 = local_50 * 2;
    local_38 = local_50 * 4;
    local_f8 = 0;
    local_58 = local_90;
    do {
      if (0 < __fn[1].d) {
        local_48 = local_58 + local_f8;
        local_128 = 0;
        lVar10 = local_68;
        do {
          sVar13 = (size_t)__fn[1].w;
          iVar9 = __fn[1].h;
          pvVar17 = __fn[1].data;
          local_100 = __fn[1].elemsize;
          local_108 = __fn[1].cstep * local_f8;
          local_118 = (size_t)iVar9;
          local_110 = (void *)(local_128 * sVar13);
          lVar12 = (long)pMVar15->w;
          local_138 = (void *)(long)pMVar15->h;
          local_120 = pMVar15->data;
          sVar6 = pMVar15->elemsize;
          local_e8 = pMVar15->cstep;
          if (local_148 == 4) {
LAB_00590ec7:
            if (0 < iVar9) {
LAB_00590ecf:
              pvVar11 = (void *)((long)local_120 +
                                sVar6 * (((long)local_138 * lVar10 + local_88) * lVar12 +
                                        local_e8 * local_90) + local_38);
              pvVar17 = (void *)((long)pvVar17 +
                                local_100 * ((long)local_110 * local_118 + local_108));
              do {
                memcpy(pvVar11,pvVar17,sVar13 * 4);
                pvVar11 = (void *)((long)pvVar11 + lVar12 * 4);
                pvVar17 = (void *)((long)pvVar17 + sVar13 * 4);
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
          }
          else if (local_148 == 2) {
LAB_00590dea:
            local_140 = CONCAT44(local_140._4_4_,iVar9);
            local_130 = lVar12;
            local_f0 = lVar10;
            local_78 = sVar13;
            if (0 < iVar9) {
              pvVar14 = (void *)((long)local_120 +
                                ((lVar10 * (long)local_138 + local_88) * lVar12 +
                                local_90 * local_e8) * sVar6 + local_40);
              local_e0 = lVar12 * 2;
              pvVar11 = (void *)(((long)local_110 * local_118 + local_108) * local_100 +
                                (long)pvVar17);
              do {
                memcpy(pvVar14,pvVar11,sVar13 * 2);
                pvVar14 = (void *)((long)pvVar14 + local_e0);
                pvVar11 = (void *)((long)pvVar11 + sVar13 * 2);
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
            lVar10 = local_f0;
            lVar12 = local_130;
            sVar13 = local_78;
            iVar9 = (int)local_140;
            if (local_148 == 4 && 0 < (int)local_140) goto LAB_00590ecf;
          }
          else if (local_148 == 1) {
            local_140 = CONCAT44(local_140._4_4_,iVar9);
            local_f0 = lVar10;
            if (0 < iVar9) {
              pvVar14 = (void *)((long)pvVar17 +
                                local_118 * local_100 * (long)local_110 + local_108 * local_100);
              pvVar11 = (void *)((long)local_120 +
                                sVar6 * lVar12 * local_88 + local_50 +
                                (local_68 + local_128) * (long)local_138 * sVar6 * lVar12 +
                                local_e8 * local_48 * sVar6);
              local_130 = lVar12;
              do {
                memcpy(pvVar11,pvVar14,sVar13);
                pvVar14 = (void *)((long)pvVar14 + sVar13);
                pvVar11 = (void *)((long)pvVar11 + local_130);
                iVar9 = iVar9 + -1;
                lVar12 = local_130;
              } while (iVar9 != 0);
            }
            lVar10 = local_f0;
            iVar9 = (int)local_140;
            if (local_148 == 4) goto LAB_00590ec7;
            if (local_148 == 2) goto LAB_00590dea;
          }
          local_128 = local_128 + 1;
          lVar10 = lVar10 + 1;
          pMVar15 = local_60;
        } while (local_128 < __fn[1].d);
      }
      local_f8 = local_f8 + 1;
      local_90 = local_90 + 1;
    } while (local_f8 < __fn[1].c);
  }
LAB_00591017:
  return 0;
}

Assistant:

int CopyTo::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& self_blob = bottom_blobs[0];
    const Mat& src_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;
    size_t elemsize = self_blob.elemsize;

    if (src_blob.dims == dims && src_blob.w == w && src_blob.h == h && src_blob.d == d && src_blob.c == channels)
    {
        top_blob = src_blob;
        return 0;
    }

    top_blob = self_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int _woffset, _hoffset, _doffset, _coffset;
    resolve_copyto_offset(self_blob.shape(), _woffset, _hoffset, _doffset, _coffset);

    if (dims == 1)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            const Mat roim = src_blob.channel(q);
            Mat m = top_blob.channel(q + _coffset);

            if (elemsize == 1)
                copy_to_image<signed char>(roim, m, _hoffset, _woffset);
            if (elemsize == 2)
                copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
            if (elemsize == 4)
                copy_to_image<float>(roim, m, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            for (int z = 0; z < src_blob.d; z++)
            {
                const Mat roim = src_blob.channel(q).depth(z);
                Mat m = top_blob.channel(q + _coffset).depth(z + _doffset);

                if (elemsize == 1)
                    copy_to_image<signed char>(roim, m, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_to_image<float>(roim, m, _hoffset, _woffset);
            }
        }
    }

    return 0;
}